

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O1

void cpacr_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  
  uVar1 = (uint)env->features;
  if ((uVar1 >> 0x1b & 1) == 0) {
    if ((env[1].xregs[0xd] & 0xf) == 0) {
      uVar1 = 0;
    }
    else {
      uVar2 = (ulong)((uVar1 & 0x100) << 0x17) ^ 0x80000000 | value;
      value = uVar2 | 0x40000000;
      if ((env[1].xregs[0xd] & 0xe) != 0) {
        value = uVar2;
      }
      uVar1 = 0xc0f00000;
    }
    value = (uint64_t)((uint)value & uVar1);
  }
  if ((env->features & 0x210000000) == 0x200000000) {
    if (env->aarch64 == 0) {
      bVar3 = (env->uncached_cpsr & 0x1f) == 0x16;
    }
    else {
      bVar3 = (~env->pstate & 0xc) == 0;
    }
    if (!bVar3) {
      bVar3 = ((env->cp15).scr_el3 & 1) == 0;
    }
    if ((!bVar3) && (((env->cp15).nsacr & 0x400) == 0)) {
      value = value & 0xffffffffff0fffff | (ulong)((uint)(env->cp15).cpacr_el1 & 0xf00000);
    }
  }
  (env->cp15).cpacr_el1 = value;
  return;
}

Assistant:

static inline int arm_feature(CPUARMState *env, int feature)
{
    return (env->features & (1ULL << feature)) != 0;
}